

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

bool __thiscall S1Interval::InteriorContains(S1Interval *this,S1Interval *y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  byte bVar5;
  
  dVar1 = (this->bounds_).c_[0];
  dVar2 = (this->bounds_).c_[1];
  dVar3 = (y->bounds_).c_[0];
  dVar4 = (y->bounds_).c_[1];
  if (dVar1 <= dVar2) {
    if (dVar3 <= dVar4) {
      if ((dVar3 <= dVar1) || (bVar5 = 1, dVar2 <= dVar4)) {
        bVar5 = -(dVar1 == -3.141592653589793) & -(dVar2 == 3.141592653589793);
      }
      goto LAB_0019baaf;
    }
    if ((dVar1 == -3.141592653589793) && (!NAN(dVar1))) {
      bVar5 = 1;
      if ((dVar2 == 3.141592653589793) && (!NAN(dVar2))) goto LAB_0019baaf;
    }
  }
  else {
    if (dVar3 <= dVar4) {
      bVar5 = 1;
      if (dVar3 <= dVar1) {
        bVar5 = dVar4 < dVar2;
      }
      goto LAB_0019baaf;
    }
    if ((dVar1 < dVar3) && (bVar5 = 1, dVar4 < dVar2)) goto LAB_0019baaf;
  }
  bVar5 = -(dVar3 == 3.141592653589793) & -(dVar4 == -3.141592653589793);
LAB_0019baaf:
  return (bool)(bVar5 & 1);
}

Assistant:

T operator[](int b) const {
    S2_DCHECK_GE(b, 0);
    S2_DCHECK_LT(b, SIZE);
    return static_cast<const D&>(*this).Data()[b];
  }